

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O2

CURLMcode mev_assess(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  curl_multi_ev *sh;
  curl_socket_t *pcVar1;
  uint uVar2;
  curl_trc_feat *pcVar3;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  CURLcode CVar7;
  uint uVar8;
  CURLMcode CVar9;
  curl_socket_t *meta_data;
  mev_sh_entry *pmVar10;
  void *pvVar11;
  connectdata *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  easy_pollset *ps_1;
  uchar last_action;
  char *pcVar16;
  uint local_5c;
  easy_pollset ps;
  ulong local_38;
  
  if (multi == (Curl_multi *)0x0) {
    return CURLM_OK;
  }
  if (multi->socket_cb == (curl_socket_callback)0x0) {
    return CURLM_OK;
  }
  ps.sockets[4] = 0;
  ps.num = 0;
  ps.actions[0] = '\0';
  ps.actions[1] = '\0';
  ps.actions[2] = '\0';
  ps.actions[3] = '\0';
  ps.actions[4] = '\0';
  ps._29_3_ = 0;
  ps.sockets[0] = 0;
  ps.sockets[1] = 0;
  ps.sockets[2] = 0;
  ps.sockets[3] = 0;
  if (conn == (connectdata *)0x0) {
    if (data != (Curl_easy *)0x0) {
      Curl_multi_getsock(data,&ps,"ev assess");
      meta_data = (curl_socket_t *)Curl_meta_get(data,"meta:mev:ps");
      goto LAB_00146ea0;
    }
  }
  else {
    Curl_conn_adjust_pollset(data,conn,&ps);
    if (data != (Curl_easy *)0x0) {
      meta_data = (curl_socket_t *)Curl_conn_meta_get(conn,"meta:mev:ps");
LAB_00146ea0:
      bVar5 = false;
      goto LAB_00146eb6;
    }
  }
  bVar5 = true;
  meta_data = (curl_socket_t *)0x0;
LAB_00146eb6:
  if ((meta_data == (curl_socket_t *)0x0) && (ps.num != 0)) {
    meta_data = (curl_socket_t *)(*Curl_ccalloc)(1,0x20);
    if (conn == (connectdata *)0x0) {
      if (meta_data == (curl_socket_t *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      CVar7 = Curl_meta_set(data,"meta:mev:ps",meta_data,mev_pollset_dtor);
    }
    else {
      if (meta_data == (curl_socket_t *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      CVar7 = Curl_conn_meta_set(conn,"meta:mev:ps",meta_data,mev_pollset_dtor);
    }
    if (CVar7 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
  }
  else if (meta_data == (curl_socket_t *)0x0) {
    return CURLM_OK;
  }
  sh = &multi->ev;
  uVar15 = 0;
  do {
    if ((ulong)ps._16_8_ >> 0x20 <= uVar15) {
      uVar15 = 0;
      do {
        if ((uint)meta_data[5] <= uVar15) {
          meta_data[4] = ps.sockets[4];
          meta_data[5] = ps.num;
          *(undefined8 *)(meta_data + 6) = ps._24_8_;
          *(undefined8 *)meta_data = ps.sockets._0_8_;
          *(undefined8 *)(meta_data + 2) = ps.sockets._8_8_;
          return CURLM_OK;
        }
        uVar2 = meta_data[uVar15];
        uVar14 = 0;
        do {
          if ((ulong)ps._16_8_ >> 0x20 == uVar14) {
            pmVar10 = mev_sh_entry_get(&sh->sh_entries,uVar2);
            if (pmVar10 == (mev_sh_entry *)0x0) break;
            if (conn == (connectdata *)0x0) {
              _Var6 = Curl_uint_spbset_contains(&pmVar10->xfers,data->mid);
              if (_Var6) {
                Curl_uint_spbset_remove(&pmVar10->xfers,data->mid);
                goto LAB_00147285;
              }
              if ((((data->set).field_0x89f & 0x40) == 0) ||
                 (((pcVar3 = (data->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                   (pcVar3->log_level < 1)) || (Curl_trc_feat_multi.log_level < 1)))) break;
              pcVar16 = "ev entry fd=%d, transfer lost interest but is not registered";
            }
            else {
              if (pmVar10->conn == conn) {
                pmVar10->conn = (connectdata *)0x0;
LAB_00147285:
                uVar8 = Curl_uint_spbset_count(&pmVar10->xfers);
                if (uVar8 == -(uint)(pmVar10->conn != (connectdata *)0x0)) {
                  CVar9 = mev_forget_socket(multi,data,uVar2,"last user gone");
                  if (CVar9 != CURLM_OK) {
                    return CVar9;
                  }
                }
                else {
                  CVar9 = mev_sh_entry_update(multi,data,pmVar10,uVar2,
                                              *(uchar *)((long)meta_data + uVar15 + 0x18),'\0');
                  if (CVar9 != CURLM_OK) {
                    return CVar9;
                  }
                  if ((((!bVar5) && (((data->set).field_0x89f & 0x40) != 0)) &&
                      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar3->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
                    uVar8 = Curl_uint_spbset_count(&pmVar10->xfers);
                    Curl_trc_multi(data,"ev entry fd=%d, removed transfer, total=%u/%d (xfer/conn)",
                                   (ulong)uVar2,(ulong)uVar8,
                                   (ulong)(pmVar10->conn != (connectdata *)0x0));
                  }
                }
                break;
              }
              if (((bVar5) || (((data->set).field_0x89f & 0x40) == 0)) ||
                 (((pcVar3 = (data->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                   (pcVar3->log_level < 1)) || (Curl_trc_feat_multi.log_level < 1)))) break;
              pcVar16 = "ev entry fd=%d, conn lost interest but is not registered";
            }
            Curl_trc_multi(data,pcVar16,(ulong)uVar2);
            break;
          }
          pcVar1 = ps.sockets + uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar2 != *pcVar1);
        uVar15 = uVar15 + 1;
      } while( true );
    }
    uVar2 = ps.sockets[uVar15];
    pmVar10 = mev_sh_entry_get(&sh->sh_entries,uVar2);
    if (pmVar10 == (mev_sh_entry *)0x0) {
      local_5c = uVar2;
      pmVar10 = mev_sh_entry_get(&sh->sh_entries,uVar2);
      if (pmVar10 == (mev_sh_entry *)0x0) {
        pmVar10 = (mev_sh_entry *)(*Curl_ccalloc)(1,0x50);
        if (pmVar10 == (mev_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_uint_spbset_init((uint_spbset *)pmVar10);
        pvVar11 = Curl_hash_add(&sh->sh_entries,&local_5c,4,pmVar10);
        if (pvVar11 == (void *)0x0) {
          mev_sh_entry_dtor(pmVar10);
          return CURLM_OUT_OF_MEMORY;
        }
      }
      if ((((!bVar5) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"ev new entry fd=%d",(ulong)uVar2);
      }
      if (conn == (connectdata *)0x0) {
LAB_00147099:
        _Var6 = Curl_uint_spbset_add(&pmVar10->xfers,data->mid);
        bVar4 = true;
        if (!_Var6) {
          return CURLM_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar12 = pmVar10->conn;
LAB_00147043:
        if (pcVar12 != (connectdata *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        pmVar10->conn = conn;
        bVar4 = false;
        last_action = '\0';
        if (bVar5) goto LAB_00147173;
      }
      if (((data->set).field_0x89f & 0x40) == 0) {
LAB_001470bd:
        last_action = '\0';
      }
      else {
        pcVar3 = (data->state).feat;
        if (pcVar3 == (curl_trc_feat *)0x0) {
          if (Curl_trc_feat_multi.log_level < 1) goto LAB_001470bd;
        }
        else {
          last_action = '\0';
          if ((pcVar3->log_level < 1) || (Curl_trc_feat_multi.log_level < 1)) goto LAB_00147173;
        }
        pcVar16 = "connection";
        if (bVar4) {
          pcVar16 = "transfer";
          local_38 = (ulong)data->mid;
        }
        else {
          local_38 = conn->connection_id;
        }
        uVar8 = Curl_uint_spbset_count(&pmVar10->xfers);
        last_action = '\0';
        Curl_trc_multi(data,"ev entry fd=%d, added %s #%ld, total=%u/%d (xfer/conn)",(ulong)uVar2,
                       pcVar16,local_38,(ulong)uVar8,(uint)(pmVar10->conn != (connectdata *)0x0));
      }
    }
    else {
      if (conn == (connectdata *)0x0) {
        _Var6 = Curl_uint_spbset_contains(&pmVar10->xfers,data->mid);
        if (!_Var6) goto LAB_00147099;
      }
      else {
        pcVar12 = pmVar10->conn;
        if (pcVar12 != conn) goto LAB_00147043;
      }
      uVar14 = 0;
      do {
        uVar13 = uVar14;
        if ((uint)meta_data[5] == uVar13) goto LAB_001470bd;
        uVar14 = uVar13 + 1;
      } while (uVar2 != meta_data[uVar13]);
      last_action = *(uchar *)((long)meta_data + uVar13 + 0x18);
    }
LAB_00147173:
    CVar9 = mev_sh_entry_update(multi,data,pmVar10,uVar2,last_action,ps.actions[uVar15]);
    uVar15 = uVar15 + 1;
    if (CVar9 != CURLM_OK) {
      return CVar9;
    }
  } while( true );
}

Assistant:

static CURLMcode mev_assess(struct Curl_multi *multi,
                            struct Curl_easy *data,
                            struct connectdata *conn)
{
  if(multi && multi->socket_cb) {
    struct easy_pollset ps, *last_ps;

    mev_init_cur_pollset(&ps, data, conn);
    last_ps = mev_get_last_pollset(data, conn);

    if(!last_ps && ps.num) {
      if(conn)
        last_ps = mev_add_new_conn_pollset(conn);
      else
        last_ps = mev_add_new_xfer_pollset(data);
      if(!last_ps)
        return CURLM_OUT_OF_MEMORY;
    }

    if(last_ps)
      return mev_pollset_diff(multi, data, conn, &ps, last_ps);
    else
      DEBUGASSERT(!ps.num);
  }
  return CURLM_OK;
}